

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O2

void HTS_Label_load_from_fn(HTS_Label *label,size_t sampling_rate,size_t fperiod,char *fn)

{
  HTS_Boolean HVar1;
  HTS_File *fp;
  ushort **ppuVar2;
  HTS_LabelString *pHVar3;
  char *pcVar4;
  HTS_LabelString *pHVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  char local_438 [1032];
  
  fp = HTS_fopen_from_fn(fn,"r");
  if ((label->head == (HTS_LabelString *)0x0) && (label->size == 0)) {
    auVar8._8_4_ = (int)(sampling_rate >> 0x20);
    auVar8._0_8_ = sampling_rate;
    auVar8._12_4_ = 0x45300000;
    auVar9._8_4_ = (int)(fperiod >> 0x20);
    auVar9._0_8_ = fperiod;
    auVar9._12_4_ = 0x45300000;
    dVar10 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sampling_rate) - 4503599627370496.0)) /
             (((auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)fperiod) - 4503599627370496.0)) * 10000000.0);
    pHVar5 = (HTS_LabelString *)0x0;
    while( true ) {
      HVar1 = HTS_get_token_from_fp(fp,local_438);
      if (HVar1 == '\0') break;
      ppuVar2 = __ctype_b_loc();
      if (-1 < (short)(*ppuVar2)[local_438[0]]) break;
      label->size = label->size + 1;
      pHVar3 = (HTS_LabelString *)HTS_calloc(1,0x20);
      if (pHVar5 == (HTS_LabelString *)0x0) {
        pHVar5 = (HTS_LabelString *)label;
      }
      pHVar5->next = pHVar3;
      HVar1 = isdigit_string(local_438);
      dVar6 = -1.0;
      dVar7 = -1.0;
      if (HVar1 != '\0') {
        dVar6 = atof(local_438);
        HTS_get_token_from_fp(fp,local_438);
        dVar7 = atof(local_438);
        HTS_get_token_from_fp(fp,local_438);
        dVar6 = dVar6 * dVar10;
        dVar7 = dVar7 * dVar10;
      }
      pHVar3->start = dVar6;
      pHVar3->end = dVar7;
      pHVar3->next = (_HTS_LabelString *)0x0;
      pcVar4 = HTS_strdup(local_438);
      pHVar3->name = pcVar4;
      pHVar5 = pHVar3;
    }
    HTS_Label_check_time(label);
  }
  else {
    HTS_error(1,"HTS_Label_load_from_fp: label is not initialized.\n");
  }
  HTS_fclose(fp);
  return;
}

Assistant:

void HTS_Label_load_from_fn(HTS_Label * label, size_t sampling_rate, size_t fperiod, const char *fn)
{
   HTS_File *fp = HTS_fopen_from_fn(fn, "r");
   HTS_Label_load(label, sampling_rate, fperiod, fp);
   HTS_fclose(fp);
}